

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

bool __thiscall
cmIfCommand::InvokeInitialPass
          (cmIfCommand *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  ulong uVar1;
  cmIfFunctionBlocker *this_01;
  cmIfFunctionBlocker *f;
  string local_180;
  undefined1 local_160 [8];
  string err;
  undefined1 local_138 [7];
  bool isTrue;
  cmListFileContext local_128;
  undefined1 local_e0 [8];
  cmConditionEvaluator conditionEvaluator;
  MessageType status;
  undefined1 local_60 [8];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  cmExecutionStatus *param_2_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  cmIfCommand *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &expandedArguments.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
            ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             local_60);
  cmMakefile::ExpandArguments
            ((this->super_cmCommand).Makefile,args,
             (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             local_60,(char *)0x0);
  this_00 = (this->super_cmCommand).Makefile;
  cmMakefile::GetExecutionContext(&local_128,this_00);
  cmMakefile::GetBacktrace((cmMakefile *)local_138);
  cmConditionEvaluator::cmConditionEvaluator
            ((cmConditionEvaluator *)local_e0,this_00,&local_128,(cmListFileBacktrace *)local_138);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_138);
  cmListFileContext::~cmListFileContext(&local_128);
  err.field_2._M_local_buf[0xf] =
       cmConditionEvaluator::IsTrue
                 ((cmConditionEvaluator *)local_e0,
                  (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_60,(string *)
                           &expandedArguments.
                            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  &conditionEvaluator.Policy57Status);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmIfCommandError_abi_cxx11_
              (&local_180,
               (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               local_60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   "if ",&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::operator+=
              ((string *)local_160,
               (string *)
               &expandedArguments.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (conditionEvaluator.Policy57Status != NEW) {
      cmMakefile::IssueMessage
                ((this->super_cmCommand).Makefile,conditionEvaluator.Policy57Status,
                 (string *)local_160);
    }
    else {
      cmMakefile::IssueMessage((this->super_cmCommand).Makefile,FATAL_ERROR,(string *)local_160);
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_160);
    if (conditionEvaluator.Policy57Status == NEW) goto LAB_0022eaa2;
  }
  this_01 = (cmIfFunctionBlocker *)operator_new(0x88);
  memset(this_01,0,0x88);
  cmIfFunctionBlocker::cmIfFunctionBlocker(this_01);
  this_01->ScopeDepth = 1;
  this_01->IsBlocking = (bool)((err.field_2._M_local_buf[0xf] ^ 0xffU) & 1);
  if ((err.field_2._M_local_buf[0xf] & 1U) != 0) {
    this_01->HasRun = true;
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
            (&this_01->Args,args);
  cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,(cmFunctionBlocker *)this_01);
  this_local._7_1_ = 1;
LAB_0022eaa2:
  cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_e0);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             local_60);
  std::__cxx11::string::~string
            ((string *)
             &expandedArguments.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmIfCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus&)
{
  std::string errorString;

  std::vector<cmExpandedCommandArgument> expandedArguments;
  this->Makefile->ExpandArguments(args, expandedArguments);

  MessageType status;

  cmConditionEvaluator conditionEvaluator(
    *(this->Makefile), this->Makefile->GetExecutionContext(),
    this->Makefile->GetBacktrace());

  bool isTrue =
    conditionEvaluator.IsTrue(expandedArguments, errorString, status);

  if (!errorString.empty()) {
    std::string err = "if " + cmIfCommandError(expandedArguments);
    err += errorString;
    if (status == MessageType::FATAL_ERROR) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, err);
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    this->Makefile->IssueMessage(status, err);
  }

  cmIfFunctionBlocker* f = new cmIfFunctionBlocker();
  // if is isn't true block the commands
  f->ScopeDepth = 1;
  f->IsBlocking = !isTrue;
  if (isTrue) {
    f->HasRun = true;
  }
  f->Args = args;
  this->Makefile->AddFunctionBlocker(f);

  return true;
}